

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

void __thiscall ONX_ModelTest::Dump(ONX_ModelTest *this,ON_TextLog *text_log)

{
  Type test_type;
  char *pcVar1;
  wchar_t *pwVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  ON_wString test_log_source_archive;
  
  test_type = this->m_test_type;
  pcVar1 = TestTypeToString(test_type);
  ON_TextLog::Print(text_log,"Test type: %s\n",pcVar1);
  TextLogSource3dmFilePath((ONX_ModelTest *)&test_log_source_archive);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&test_log_source_archive);
  ON_TextLog::Print(text_log,L"Source 3dm file path: %ls\n",pwVar2);
  ON_TextLog::Print(text_log,L"Source 3dm file version: %u\n",
                    (ulong)this->m_model_3dm_file_version[0]);
  ON_TextLog::Print(text_log,"Result: ");
  InternalDumpResultAndErrorCount(this->m_test_result,this->m_error_count,text_log);
  bVar8 = 0x30 < this->m_model_3dm_file_version[0] - 1;
  uVar7 = 3;
  if (test_type != ReadWriteReadCompare || bVar8) {
    uVar7 = (ulong)test_type;
  }
  bVar5 = (this->m_error_count).m_error_count + (this->m_error_count).m_failure_count +
          (this->m_error_count).m_warning_count == 0 && this->m_test_result == Pass;
  lVar3 = 0x50;
  for (uVar4 = 0; (bVar5 && (uVar4 <= uVar7)); uVar4 = uVar4 + 1) {
    bVar5 = *(int *)((long)this->m_model_3dm_file_version + lVar3 + -0x1c) +
            *(int *)((long)this->m_model_3dm_file_version + lVar3 + -0x20) +
            *(int *)((long)this->m_model_3dm_file_version + lVar3 + -0x18) == 0 &&
            this->m_test_results[uVar4] == Pass;
    lVar3 = lVar3 + 0x18;
  }
  if (bVar5) {
    if (test_type != ReadWriteReadCompare || bVar8) goto LAB_0048a3bd;
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"Compare test skipped because source file version is too old.\n");
  }
  else {
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,"Initialization: ");
    InternalDumpResultAndErrorCount(this->m_test_results[0],this->m_error_counts[0],text_log);
    if (uVar7 != 0) {
      ON_TextLog::Print(text_log,"Read source file: ");
      InternalDumpResultAndErrorCount(this->m_test_results[1],this->m_error_counts[1],text_log);
      uVar6 = (uint)uVar7;
      if (uVar6 != 1) {
        ON_TextLog::Print(text_log,"Write temporary files: ");
        InternalDumpResultAndErrorCount(this->m_test_results[2],this->m_error_counts[2],text_log);
        if (2 < uVar6) {
          ON_TextLog::Print(text_log,"Read temporary files: ");
          InternalDumpResultAndErrorCount(this->m_test_results[3],this->m_error_counts[3],text_log);
          if (uVar6 != 3) {
            ON_TextLog::Print(text_log,"Compare models from source and temporary file: ");
            InternalDumpResultAndErrorCount
                      (this->m_test_results[4],this->m_error_counts[4],text_log);
          }
        }
      }
    }
  }
  ON_TextLog::PopIndent(text_log);
LAB_0048a3bd:
  ON_wString::~ON_wString(&test_log_source_archive);
  return;
}

Assistant:

void ONX_ModelTest::Dump(ON_TextLog& text_log) const
{
  const ONX_ModelTest::Type test_type = TestType();

  text_log.Print("Test type: %s\n", ONX_ModelTest::TestTypeToString(test_type));

  //const ON_wString source_archive = Source3dmFilePath();
  const ON_wString test_log_source_archive = TextLogSource3dmFilePath();
  text_log.Print(L"Source 3dm file path: %ls\n", static_cast<const wchar_t*>(test_log_source_archive));
  text_log.Print(L"Source 3dm file version: %u\n", Source3dmFileVersion());

  text_log.Print("Result: ");
  InternalDumpResultAndErrorCount(m_test_result, m_error_count, text_log);

  //const int i_rwrcompare = static_cast<const unsigned char>(ONX_ModelTest::Type::ReadWriteReadCompare);
  const bool bSkipCompare
    = ONX_ModelTest::SkipCompare(Source3dmFileVersion())
    && ONX_ModelTest::Type::ReadWriteReadCompare == test_type;
  const unsigned int imax
    = bSkipCompare
    ? static_cast<const unsigned char>(ONX_ModelTest::Type::ReadWriteRead)
    : static_cast<const unsigned char>(test_type);
  bool bSkipDetails = InternalCleanPass(m_test_result, m_error_count);
  for (unsigned int i = 0; i <= imax && bSkipDetails; i++)
  {
    bSkipDetails = InternalCleanPass(m_test_results[i], m_error_counts[i]);
  }  

  if (bSkipDetails)
  {
    if (bSkipCompare)
    {
      text_log.PushIndent();
      text_log.Print("Compare test skipped because source file version is too old.\n");
      text_log.PopIndent();
    }
    return;
  }

  text_log.PushIndent();
  for(;;)
  {
    unsigned int i = 0;
    text_log.Print("Initialization: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Read source file: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Write temporary files: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Read temporary files: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    i++;
    text_log.Print("Compare models from source and temporary file: ");
    InternalDumpResultAndErrorCount(m_test_results[i], m_error_counts[i], text_log);
    if (i >= imax)
      break;

    break;
  }
  text_log.PopIndent();  
}